

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_Mesh::SetSurfaceParamtersFromTextureCoodinates(ON_Mesh *this)

{
  ON_2dPointArray *this_00;
  uint uVar1;
  uint uVar2;
  long lVar3;
  ON_Interval dom;
  ON_2dPoint S;
  ON_Interval local_58;
  ON_2dPoint local_40;
  
  uVar1 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
  ON_Interval::ON_Interval(&local_58);
  uVar2 = (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count;
  this_00 = &this->m_S;
  if (uVar1 == uVar2) {
    ON_Interval::Set(&local_58,0.0,1.0);
    if (-1 < (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity) {
      (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count = 0;
    }
    ON_SimpleArray<ON_2dPoint>::Reserve(&this_00->super_ON_SimpleArray<ON_2dPoint>,(ulong)uVar1);
    for (lVar3 = 0; (ulong)uVar1 * 8 - lVar3 != 0; lVar3 = lVar3 + 8) {
      ON_2dPoint::ON_2dPoint
                (&local_40,
                 (ON_2fPoint *)
                 ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x + lVar3));
      ON_SimpleArray<ON_2dPoint>::Append(&this_00->super_ON_SimpleArray<ON_2dPoint>,&local_40);
    }
  }
  else {
    local_58.m_t[0] = ON_Interval::EmptyInterval.m_t[0];
    local_58.m_t[1] = ON_Interval::EmptyInterval.m_t[1];
    ON_SimpleArray<ON_2dPoint>::Destroy(&this_00->super_ON_SimpleArray<ON_2dPoint>);
  }
  *(double *)&this->field_0x240 = local_58.m_t[0];
  *(double *)&this->field_0x248 = local_58.m_t[1];
  *(double *)&this->field_0x250 = local_58.m_t[0];
  *(double *)&this->field_0x258 = local_58.m_t[1];
  this->m_srf_scale[0] = 0.0;
  this->m_srf_scale[1] = 0.0;
  *(double *)&this->field_0x270 = local_58.m_t[0];
  *(double *)&this->field_0x278 = local_58.m_t[1];
  *(double *)&this->field_0x280 = local_58.m_t[0];
  *(double *)&this->field_0x288 = local_58.m_t[1];
  this->m_packed_tex_rotate = false;
  return uVar1 == uVar2;
}

Assistant:

bool ON_Mesh::SetSurfaceParamtersFromTextureCoodinates()
{
  unsigned int i;
  const unsigned int vcount = m_V.UnsignedCount();

  bool rc;
  ON_Interval dom;
  if (vcount == m_T.UnsignedCount())
  {
    dom.Set(0.0, 1.0);
    m_S.SetCount(0);
    m_S.Reserve(vcount);
    for (i = 0; i < vcount; i++)
    {
      ON_2dPoint S = m_T[i];
      m_S.Append(S);
    }
    rc = true;
  }
  else
  {
    dom = ON_Interval::EmptyInterval;
    m_S.Destroy();
    rc = false;
  }

  m_srf_domain[0] = dom;
  m_srf_domain[1] = dom;
  m_srf_scale[0] = 0.0;
  m_srf_scale[1] = 0.0;
  m_packed_tex_domain[0] = dom;
  m_packed_tex_domain[1] = dom;
  m_packed_tex_rotate = false;

  return rc;

  //bool rc = (vcount > 0 && vcount == m_T.UnsignedCount() && vcount != m_S.UnsignedCount());
  //if (!rc)
  //  return false;
  //  
  //ON_2dPoint Tmin = m_T[0];
  //ON_2dPoint Tmax = m_T[0];
  //ON_2dPoint T;
  //for (i = 1; i < vcount; i++)
  //{
  //  T = m_T[i];
  //  if (T.x < Tmin.x)
  //    Tmin.x = T.x;
  //  else if (T.x > Tmax.x)
  //    Tmax.x = T.x;
  //  if (T.y < Tmin.y)
  //    Tmin.y = T.y;
  //  else if (T.y > Tmax.y)
  //    Tmax.y = T.y;
  //}
  //  
  //rc = (0.0f <= Tmin.x && Tmax.x <= 1.0f && 0.0f <= Tmin.y && Tmax.y <= 1.0f);
  //if (!rc)
  //  return false;

  //ON_Interval packed_tex_domain[2];
  //packed_tex_domain[0] = m_packed_tex_domain[0];
  //packed_tex_domain[1] = m_packed_tex_domain[1];
  //const float Ttol = 1.0e-5f;

  //if (packed_tex_domain[0].IsIncreasing() && packed_tex_domain[1].IsIncreasing())
  //{
  //  rc = (packed_tex_domain[0].IsIncreasing() && packed_tex_domain[1].IsIncreasing());
  //  if (!rc)
  //    return false;
  //  rc = (packed_tex_domain[0][0] <= Tmin.x && Tmax.x <= packed_tex_domain[0][1]);
  //  if (!rc)
  //    return false;
  //  rc = (packed_tex_domain[1][0] <= Tmin.y && Tmax.y <= packed_tex_domain[1][1]);
  //  if (!rc)
  //    return false;
  //}
  //else if (Tmin.x > Ttol || Tmax.x < 1.0 - Ttol || Tmin.y > Ttol || Tmax.y < 1.0 - Ttol)
  //{
  //  packed_tex_domain[0].Set(Tmin.x, Tmax.x);
  //  packed_tex_domain[1].Set(Tmin.y, Tmax.y);
  //}
  //else
  //{
  //  packed_tex_domain[0].Set(0.0, 1.0);
  //  packed_tex_domain[1].Set(0.0, 1.0);
  //}

  //ON_Interval Sdomain[2];
  //if (m_packed_tex_rotate)
  //{
  //  Sdomain[0] = packed_tex_domain[1];
  //  Sdomain[1].Set(1.0 - packed_tex_domain[0][1], 1.0 - packed_tex_domain[0][0]);
  //}
  //else
  //{
  //  Sdomain[0] = packed_tex_domain[0];
  //  Sdomain[1] = packed_tex_domain[1];
  //}

  //rc = Sdomain[0].IsIncreasing() && Sdomain[1].IsIncreasing();
  //if (!rc)
  //  return false;

  //m_packed_tex_domain[0] = packed_tex_domain[0];
  //m_packed_tex_domain[1] = packed_tex_domain[1];
  //m_srf_scale[0] = 0.0;
  //m_srf_scale[1] = 0.0;
  //m_srf_domain[0] = Sdomain[0];
  //m_srf_domain[1] = Sdomain[1];

  //m_S.Reserve(vcount);
  //m_S.SetCount(0);
  //ON_2dPoint S;
  //if (m_packed_tex_rotate)
  //{
  //  for (i = 0; i < vcount; i++)
  //  {
  //    T = m_T[i];
  //    double x = m_packed_tex_domain[0].NormalizedParameterAt(T.x);
  //    double y = m_packed_tex_domain[1].NormalizedParameterAt(T.y);
  //    S.x = m_srf_domain[0].ParameterAt(y);
  //    S.y = m_srf_domain[1].ParameterAt(1.0 - x);
  //    S = T;
  //    m_S.Append(S);
  //  }
  //}
  //else
  //{
  //  for (i = 0; i < vcount; i++)
  //  { 
  //    T = m_T[i];
  //    S = T;
  //    m_S.Append(S);
  //  }
  //}

  //return true;
}